

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O0

int delay_wait_for_top_right_sb(AV1_COMP *cpi)

{
  MODE MVar1;
  int iVar2;
  AV1_COMP *in_RDI;
  MODE mode;
  bool local_12;
  uint local_4;
  
  MVar1 = (in_RDI->oxcf).mode;
  if (MVar1 == '\0') {
    local_4 = 0;
  }
  else if (MVar1 == '\x02') {
    local_4 = is_mode_coeff_dv_upd_freq_tile_or_off(in_RDI);
  }
  else if (MVar1 == '\x01') {
    iVar2 = is_mode_coeff_dv_upd_freq_tile_or_off(in_RDI);
    local_12 = false;
    if (iVar2 != 0) {
      local_12 = (in_RDI->sf).inter_sf.mv_cost_upd_level < INTERNAL_COST_UPD_SBROW_SET;
    }
    local_4 = (uint)local_12;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static inline int delay_wait_for_top_right_sb(const AV1_COMP *const cpi) {
  const MODE mode = cpi->oxcf.mode;
  if (mode == GOOD) return 0;

  if (mode == ALLINTRA)
    return is_mode_coeff_dv_upd_freq_tile_or_off(cpi);
  else if (mode == REALTIME)
    return (is_mode_coeff_dv_upd_freq_tile_or_off(cpi) &&
            cpi->sf.inter_sf.mv_cost_upd_level <= INTERNAL_COST_UPD_TILE);
  else
    return 0;
}